

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall
cmDocumentation::CheckOptions(cmDocumentation *this,int argc,char **argv,char *exitOpt)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  string local_140;
  int local_120;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  RequestedHelpItem help_1;
  bool local_85;
  int i;
  bool result;
  undefined1 local_78 [8];
  RequestedHelpItem help;
  char *exitOpt_local;
  char **argv_local;
  int argc_local;
  cmDocumentation *this_local;
  
  help.Argument.field_2._8_8_ = exitOpt;
  if (argc == 1) {
    RequestedHelpItem::RequestedHelpItem((RequestedHelpItem *)local_78);
    local_78._0_4_ = Usage;
    std::
    vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
    ::push_back(&this->RequestedHelpItems,(RequestedHelpItem *)local_78);
    this_local._7_1_ = 1;
    RequestedHelpItem::~RequestedHelpItem((RequestedHelpItem *)local_78);
  }
  else {
    local_85 = false;
    for (help_1.Argument.field_2._12_4_ = 1; (int)help_1.Argument.field_2._12_4_ < argc;
        help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1) {
      if ((help.Argument.field_2._8_8_ != 0) &&
         (iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                         (char *)help.Argument.field_2._8_8_), iVar2 == 0)) {
        this_local._7_1_ = local_85 & 1;
        goto LAB_00190204;
      }
      RequestedHelpItem::RequestedHelpItem((RequestedHelpItem *)local_d8);
      iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"-help");
      if (((((iVar2 == 0) ||
            (iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help"), iVar2 == 0)) ||
           (iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"/?"), iVar2 == 0)) ||
          ((iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"-usage"), iVar2 == 0 ||
           (iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"-h"), iVar2 == 0)))) ||
         (iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"-H"), iVar2 == 0)) {
        local_d8._0_4_ = Help;
        if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
           (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1)) {
          std::__cxx11::string::operator=
                    ((string *)(help_1.Filename.field_2._M_local_buf + 8),
                     argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
          help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
        }
        cmsys::SystemTools::LowerCase(&local_f8,(string *)((long)&help_1.Filename.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(help_1.Filename.field_2._M_local_buf + 8),(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          local_d8._0_4_ = OneCommand;
        }
LAB_0019018c:
        if (local_d8._0_4_ != None) {
          local_85 = true;
          std::
          vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
          ::push_back(&this->RequestedHelpItems,(value_type *)local_d8);
        }
        local_120 = 0;
      }
      else {
        iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-properties");
        if (iVar2 == 0) {
          local_d8._0_4_ = OneManual;
          std::__cxx11::string::operator=
                    ((string *)(help_1.Filename.field_2._M_local_buf + 8),"cmake-properties.7");
          if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
             (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1)) {
            std::__cxx11::string::operator=
                      ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
            help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
          }
          WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
          goto LAB_0019018c;
        }
        iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-policies");
        if (iVar2 == 0) {
          local_d8._0_4_ = OneManual;
          std::__cxx11::string::operator=
                    ((string *)(help_1.Filename.field_2._M_local_buf + 8),"cmake-policies.7");
          if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
             (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1)) {
            std::__cxx11::string::operator=
                      ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
            help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
          }
          WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
          goto LAB_0019018c;
        }
        iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-variables");
        if (iVar2 == 0) {
          local_d8._0_4_ = OneManual;
          std::__cxx11::string::operator=
                    ((string *)(help_1.Filename.field_2._M_local_buf + 8),"cmake-variables.7");
          if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
             (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1)) {
            std::__cxx11::string::operator=
                      ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
            help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
          }
          WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
          goto LAB_0019018c;
        }
        iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-modules");
        if (iVar2 == 0) {
          local_d8._0_4_ = OneManual;
          std::__cxx11::string::operator=
                    ((string *)(help_1.Filename.field_2._M_local_buf + 8),"cmake-modules.7");
          if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
             (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1)) {
            std::__cxx11::string::operator=
                      ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
            help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
          }
          WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
          goto LAB_0019018c;
        }
        iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-custom-modules");
        if (iVar2 == 0) {
          if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
             (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1)) {
            std::__cxx11::string::operator=
                      ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
            help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"Warning: --help-custom-modules no longer supported",
                     &local_119);
          cmSystemTools::Message(&local_118,(char *)0x0);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator(&local_119);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) != 0) {
            this_local._7_1_ = 1;
            local_120 = 1;
            goto LAB_001901be;
          }
          local_d8._0_4_ = OldCustomModules;
          cmsys::SystemTools::GetFilenameName(&local_140,(string *)&help_1);
          std::__cxx11::string::operator=
                    ((string *)(help_1.Filename.field_2._M_local_buf + 8),(string *)&local_140);
          std::__cxx11::string::~string((string *)&local_140);
          goto LAB_0019018c;
        }
        iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-commands");
        if (iVar2 == 0) {
          local_d8._0_4_ = OneManual;
          std::__cxx11::string::operator=
                    ((string *)(help_1.Filename.field_2._M_local_buf + 8),"cmake-commands.7");
          if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
             (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1)) {
            std::__cxx11::string::operator=
                      ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
            help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
          }
          WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
          goto LAB_0019018c;
        }
        iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-compatcommands");
        if (iVar2 == 0) {
          if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
             (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1)) {
            std::__cxx11::string::operator=
                      ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
            help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,"Warning: --help-compatcommands no longer supported",
                     &local_161);
          cmSystemTools::Message(&local_160,(char *)0x0);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator(&local_161);
          this_local._7_1_ = 1;
          local_120 = 1;
        }
        else {
          iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-full");
          if (iVar2 == 0) {
            local_d8._0_4_ = Full;
            if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
               (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1))
            {
              std::__cxx11::string::operator=
                        ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
              help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
            }
            WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
            goto LAB_0019018c;
          }
          iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-html");
          if (iVar2 == 0) {
            if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
               (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1))
            {
              std::__cxx11::string::operator=
                        ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
              help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_188,"Warning: --help-html no longer supported",&local_189);
            cmSystemTools::Message(&local_188,(char *)0x0);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator(&local_189);
            this_local._7_1_ = 1;
            local_120 = 1;
          }
          else {
            iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-man");
            if (iVar2 != 0) {
              iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-command");
              if (iVar2 == 0) {
                local_d8._0_4_ = OneCommand;
                if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                   (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]),
                   !bVar1)) {
                  std::__cxx11::string::operator=
                            ((string *)(help_1.Filename.field_2._M_local_buf + 8),
                             argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                  help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                }
                if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                   (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]),
                   !bVar1)) {
                  std::__cxx11::string::operator=
                            ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                  help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                }
                cmsys::SystemTools::LowerCase
                          (&local_1d8,(string *)((long)&help_1.Filename.field_2 + 8));
                std::__cxx11::string::operator=
                          ((string *)(help_1.Filename.field_2._M_local_buf + 8),(string *)&local_1d8
                          );
                std::__cxx11::string::~string((string *)&local_1d8);
                WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
              }
              else {
                iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-module");
                if (iVar2 == 0) {
                  local_d8._0_4_ = OneModule;
                  if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                     (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]),
                     !bVar1)) {
                    std::__cxx11::string::operator=
                              ((string *)(help_1.Filename.field_2._M_local_buf + 8),
                               argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                    help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                  }
                  if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                     (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]),
                     !bVar1)) {
                    std::__cxx11::string::operator=
                              ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]
                              );
                    help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                  }
                  WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
                }
                else {
                  iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-property");
                  if (iVar2 == 0) {
                    local_d8._0_4_ = OneProperty;
                    if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                       (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]),
                       !bVar1)) {
                      std::__cxx11::string::operator=
                                ((string *)(help_1.Filename.field_2._M_local_buf + 8),
                                 argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                      help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                    }
                    if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                       (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]),
                       !bVar1)) {
                      std::__cxx11::string::operator=
                                ((string *)&help_1,
                                 argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                      help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                    }
                    WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
                  }
                  else {
                    iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-policy");
                    if (iVar2 == 0) {
                      local_d8._0_4_ = OnePolicy;
                      if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                         (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1])
                         , !bVar1)) {
                        std::__cxx11::string::operator=
                                  ((string *)(help_1.Filename.field_2._M_local_buf + 8),
                                   argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                        help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                      }
                      if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                         (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1])
                         , !bVar1)) {
                        std::__cxx11::string::operator=
                                  ((string *)&help_1,
                                   argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                        help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                      }
                      WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
                    }
                    else {
                      iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-variable");
                      if (iVar2 == 0) {
                        local_d8._0_4_ = OneVariable;
                        if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                           (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1
                                                      ]), !bVar1)) {
                          std::__cxx11::string::operator=
                                    ((string *)(help_1.Filename.field_2._M_local_buf + 8),
                                     argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                          help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                        }
                        if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                           (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1
                                                      ]), !bVar1)) {
                          std::__cxx11::string::operator=
                                    ((string *)&help_1,
                                     argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                          help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                        }
                        WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
                      }
                      else {
                        iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],"--help-manual");
                        if (iVar2 == 0) {
                          local_d8._0_4_ = OneManual;
                          if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                             (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ +
                                                         1]), !bVar1)) {
                            std::__cxx11::string::operator=
                                      ((string *)(help_1.Filename.field_2._M_local_buf + 8),
                                       argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                            help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                          }
                          if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                             (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ +
                                                         1]), !bVar1)) {
                            std::__cxx11::string::operator=
                                      ((string *)&help_1,
                                       argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                            help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                          }
                          WarnFormFromFilename((RequestedHelpItem *)local_d8,&local_85);
                        }
                        else {
                          iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                                         "--help-command-list");
                          if (iVar2 == 0) {
                            local_d8._0_4_ = ListCommands;
                            if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                               (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_
                                                           + 1]), !bVar1)) {
                              std::__cxx11::string::operator=
                                        ((string *)&help_1,
                                         argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                              help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                            }
                          }
                          else {
                            iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                                           "--help-module-list");
                            if (iVar2 == 0) {
                              local_d8._0_4_ = ListModules;
                              if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                                 (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2.
                                                                        _12_4_ + 1]), !bVar1)) {
                                std::__cxx11::string::operator=
                                          ((string *)&help_1,
                                           argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                                help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
                              }
                            }
                            else {
                              iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                                             "--help-property-list");
                              if (iVar2 == 0) {
                                local_d8._0_4_ = ListProperties;
                                if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                                   (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2.
                                                                          _12_4_ + 1]), !bVar1)) {
                                  std::__cxx11::string::operator=
                                            ((string *)&help_1,
                                             argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                                  help_1.Argument.field_2._12_4_ =
                                       help_1.Argument.field_2._12_4_ + 1;
                                }
                              }
                              else {
                                iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                                               "--help-variable-list");
                                if (iVar2 == 0) {
                                  local_d8._0_4_ = ListVariables;
                                  if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                                     (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2.
                                                                            _12_4_ + 1]), !bVar1)) {
                                    std::__cxx11::string::operator=
                                              ((string *)&help_1,
                                               argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
                                    help_1.Argument.field_2._12_4_ =
                                         help_1.Argument.field_2._12_4_ + 1;
                                  }
                                }
                                else {
                                  iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                                                 "--help-policy-list");
                                  if (iVar2 == 0) {
                                    local_d8._0_4_ = ListPolicies;
                                    if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                                       (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.
                                                                              field_2._12_4_ + 1]),
                                       !bVar1)) {
                                      std::__cxx11::string::operator=
                                                ((string *)&help_1,
                                                 argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]
                                                );
                                      help_1.Argument.field_2._12_4_ =
                                           help_1.Argument.field_2._12_4_ + 1;
                                    }
                                  }
                                  else {
                                    iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                                                   "--help-manual-list");
                                    if (iVar2 == 0) {
                                      local_d8._0_4_ = ListManuals;
                                      if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                                         (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.
                                                                                field_2._12_4_ + 1])
                                         , !bVar1)) {
                                        std::__cxx11::string::operator=
                                                  ((string *)&help_1,
                                                   argv[(long)(int)help_1.Argument.field_2._12_4_ +
                                                        1]);
                                        help_1.Argument.field_2._12_4_ =
                                             help_1.Argument.field_2._12_4_ + 1;
                                      }
                                    }
                                    else {
                                      iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                                                     "--copyright");
                                      if (iVar2 == 0) {
                                        if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
                                           (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.
                                                                                  field_2._12_4_ + 1
                                                                      ]), !bVar1)) {
                                          std::__cxx11::string::operator=
                                                    ((string *)&help_1,
                                                     argv[(long)(int)help_1.Argument.field_2._12_4_
                                                          + 1]);
                                          help_1.Argument.field_2._12_4_ =
                                               help_1.Argument.field_2._12_4_ + 1;
                                        }
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_1f8,
                                                   "Warning: --copyright no longer supported",
                                                   &local_1f9);
                                        cmSystemTools::Message(&local_1f8,(char *)0x0);
                                        std::__cxx11::string::~string((string *)&local_1f8);
                                        std::allocator<char>::~allocator(&local_1f9);
                                        this_local._7_1_ = 1;
                                        local_120 = 1;
                                        goto LAB_001901be;
                                      }
                                      iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                                                     "--version");
                                      if ((((iVar2 == 0) ||
                                           (iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_]
                                                           ,"-version"), iVar2 == 0)) ||
                                          (iVar2 = strcmp(argv[(int)help_1.Argument.field_2._12_4_],
                                                          "/V"), iVar2 == 0)) &&
                                         ((local_d8._0_4_ = Version,
                                          help_1.Argument.field_2._12_4_ + 1 < argc &&
                                          (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.
                                                                                 field_2._12_4_ + 1]
                                                           ), !bVar1)))) {
                                        std::__cxx11::string::operator=
                                                  ((string *)&help_1,
                                                   argv[(long)(int)help_1.Argument.field_2._12_4_ +
                                                        1]);
                                        help_1.Argument.field_2._12_4_ =
                                             help_1.Argument.field_2._12_4_ + 1;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0019018c;
            }
            if ((help_1.Argument.field_2._12_4_ + 1 < argc) &&
               (bVar1 = IsOption(this,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]), !bVar1))
            {
              std::__cxx11::string::operator=
                        ((string *)&help_1,argv[(long)(int)help_1.Argument.field_2._12_4_ + 1]);
              help_1.Argument.field_2._12_4_ = help_1.Argument.field_2._12_4_ + 1;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b0,"Warning: --help-man no longer supported",&local_1b1);
            cmSystemTools::Message(&local_1b0,(char *)0x0);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::allocator<char>::~allocator(&local_1b1);
            this_local._7_1_ = 1;
            local_120 = 1;
          }
        }
      }
LAB_001901be:
      RequestedHelpItem::~RequestedHelpItem((RequestedHelpItem *)local_d8);
      if (local_120 != 0) goto LAB_00190204;
    }
    this_local._7_1_ = local_85 & 1;
  }
LAB_00190204:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmDocumentation::CheckOptions(int argc, const char* const* argv,
                                   const char* exitOpt)
{
  // Providing zero arguments gives usage information.
  if (argc == 1) {
    RequestedHelpItem help;
    help.HelpType = cmDocumentation::Usage;
    this->RequestedHelpItems.push_back(std::move(help));
    return true;
  }

  // Search for supported help options.

  bool result = false;
  for (int i = 1; i < argc; ++i) {
    if (exitOpt && strcmp(argv[i], exitOpt) == 0) {
      return result;
    }
    RequestedHelpItem help;
    // Check if this is a supported help option.
    if ((strcmp(argv[i], "-help") == 0) || (strcmp(argv[i], "--help") == 0) ||
        (strcmp(argv[i], "/?") == 0) || (strcmp(argv[i], "-usage") == 0) ||
        (strcmp(argv[i], "-h") == 0) || (strcmp(argv[i], "-H") == 0)) {
      help.HelpType = cmDocumentation::Help;
      GET_OPT_ARGUMENT(help.Argument);
      help.Argument = cmSystemTools::LowerCase(help.Argument);
      // special case for single command
      if (!help.Argument.empty()) {
        help.HelpType = cmDocumentation::OneCommand;
      }
    } else if (strcmp(argv[i], "--help-properties") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-properties.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-policies") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-policies.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-variables") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-variables.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-modules") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-modules.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-custom-modules") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message(
        "Warning: --help-custom-modules no longer supported");
      if (help.Filename.empty()) {
        return true;
      }
      // Avoid breaking old project builds completely by at least generating
      // the output file.  Abuse help.Argument to give the file name to
      // PrintOldCustomModules without disrupting our internal API.
      help.HelpType = cmDocumentation::OldCustomModules;
      help.Argument = cmSystemTools::GetFilenameName(help.Filename);
    } else if (strcmp(argv[i], "--help-commands") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-commands.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-compatcommands") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message(
        "Warning: --help-compatcommands no longer supported");
      return true;
    } else if (strcmp(argv[i], "--help-full") == 0) {
      help.HelpType = cmDocumentation::Full;
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-html") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --help-html no longer supported");
      return true;
    } else if (strcmp(argv[i], "--help-man") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --help-man no longer supported");
      return true;
    } else if (strcmp(argv[i], "--help-command") == 0) {
      help.HelpType = cmDocumentation::OneCommand;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      help.Argument = cmSystemTools::LowerCase(help.Argument);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-module") == 0) {
      help.HelpType = cmDocumentation::OneModule;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-property") == 0) {
      help.HelpType = cmDocumentation::OneProperty;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-policy") == 0) {
      help.HelpType = cmDocumentation::OnePolicy;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-variable") == 0) {
      help.HelpType = cmDocumentation::OneVariable;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-manual") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-command-list") == 0) {
      help.HelpType = cmDocumentation::ListCommands;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-module-list") == 0) {
      help.HelpType = cmDocumentation::ListModules;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-property-list") == 0) {
      help.HelpType = cmDocumentation::ListProperties;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-variable-list") == 0) {
      help.HelpType = cmDocumentation::ListVariables;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-policy-list") == 0) {
      help.HelpType = cmDocumentation::ListPolicies;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-manual-list") == 0) {
      help.HelpType = cmDocumentation::ListManuals;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--copyright") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --copyright no longer supported");
      return true;
    } else if ((strcmp(argv[i], "--version") == 0) ||
               (strcmp(argv[i], "-version") == 0) ||
               (strcmp(argv[i], "/V") == 0)) {
      help.HelpType = cmDocumentation::Version;
      GET_OPT_ARGUMENT(help.Filename);
    }
    if (help.HelpType != None) {
      // This is a help option.  See if there is a file name given.
      result = true;
      this->RequestedHelpItems.push_back(std::move(help));
    }
  }
  return result;
}